

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_mul_2exp(__mpz_struct *r,__mpz_struct *u,mp_bitcnt_t bits)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  mp_ptr rp;
  mp_limb_t mVar4;
  ulong n;
  ulong n_00;
  long size;
  
  uVar1 = u->_mp_size;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  n = (ulong)uVar2;
  if (uVar1 == 0) {
    iVar3 = 0;
  }
  else {
    n_00 = bits >> 6;
    size = ((bits & 0x3f) != 0) + n_00 + n;
    if (r->_mp_alloc < size) {
      rp = mpz_realloc(r,size);
    }
    else {
      rp = r->_mp_d;
    }
    if ((bits & 0x3f) == 0) {
      mpn_copyd(rp + n_00,u->_mp_d,n);
    }
    else {
      mVar4 = mpn_lshift(rp + n_00,u->_mp_d,n,(uint)bits & 0x3f);
      rp[size + -1] = mVar4;
      size = size - (ulong)(mVar4 == 0);
    }
    mpn_zero(rp,n_00);
    iVar3 = -(int)size;
    if (-1 < u->_mp_size) {
      iVar3 = (int)size;
    }
  }
  r->_mp_size = iVar3;
  return;
}

Assistant:

void
mpz_mul_2exp (mpz_t r, const mpz_t u, mp_bitcnt_t bits)
{
  mp_size_t un, rn;
  mp_size_t limbs;
  unsigned shift;
  mp_ptr rp;

  un = GMP_ABS (u->_mp_size);
  if (un == 0)
    {
      r->_mp_size = 0;
      return;
    }

  limbs = bits / GMP_LIMB_BITS;
  shift = bits % GMP_LIMB_BITS;

  rn = un + limbs + (shift > 0);
  rp = MPZ_REALLOC (r, rn);
  if (shift > 0)
    {
      mp_limb_t cy = mpn_lshift (rp + limbs, u->_mp_d, un, shift);
      rp[rn-1] = cy;
      rn -= (cy == 0);
    }
  else
    mpn_copyd (rp + limbs, u->_mp_d, un);

  mpn_zero (rp, limbs);

  r->_mp_size = (u->_mp_size < 0) ? - rn : rn;
}